

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<capnp::Response<capnp::AnyPointer>_> * __thiscall
kj::_::NullableValue<capnp::Response<capnp::AnyPointer>_>::operator=
          (NullableValue<capnp::Response<capnp::AnyPointer>_> *this,
          NullableValue<capnp::Response<capnp::AnyPointer>_> *other)

{
  Response<capnp::AnyPointer> *params;
  NullableValue<capnp::Response<capnp::AnyPointer>_> *other_local;
  NullableValue<capnp::Response<capnp::AnyPointer>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<capnp::Response<capnp::AnyPointer>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<capnp::Response<capnp::AnyPointer>>(&(other->field_1).value);
      ctor<capnp::Response<capnp::AnyPointer>,capnp::Response<capnp::AnyPointer>>
                (&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }